

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall
mkvparser::ContentEncoding::ContentEncryption::~ContentEncryption(ContentEncryption *this)

{
  long in_RDI;
  
  if (*(void **)(in_RDI + 8) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 8));
  }
  if (*(void **)(in_RDI + 0x18) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x18));
  }
  if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x28));
  }
  ContentEncAESSettings::~ContentEncAESSettings((ContentEncAESSettings *)(in_RDI + 0x48));
  return;
}

Assistant:

ContentEncoding::ContentEncryption::~ContentEncryption() {
  delete[] key_id;
  delete[] signature;
  delete[] sig_key_id;
}